

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

uint64_t double_conversion::Double::DiyFpToUint64(DiyFp diy_fp)

{
  long in_FS_OFFSET;
  uint64_t biased_exponent;
  int exponent;
  uint64_t significand;
  long local_38;
  int local_2c;
  ulong local_28;
  ulong local_20;
  DiyFp local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = DiyFp::f(&local_18);
  local_2c = DiyFp::e(&local_18);
  for (; 0x1fffffffffffff < local_28; local_28 = local_28 >> 1) {
    local_2c = local_2c + 1;
  }
  if (local_2c < 0x3cc) {
    if (local_2c < -0x432) {
      local_20 = 0;
    }
    else {
      for (; -0x432 < local_2c && (local_28 & 0x10000000000000) == 0; local_2c = local_2c + -1) {
        local_28 = local_28 << 1;
      }
      if ((local_2c == -0x432) && ((local_28 & 0x10000000000000) == 0)) {
        local_38 = 0;
      }
      else {
        local_38 = (long)(local_2c + 0x433);
      }
      local_20 = local_28 & 0xfffffffffffff | local_38 << 0x34;
    }
  }
  else {
    local_20 = 0x7ff0000000000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

static uint64_t DiyFpToUint64(DiyFp diy_fp) {
    uint64_t significand = diy_fp.f();
    int exponent = diy_fp.e();
    while (significand > kHiddenBit + kSignificandMask) {
      significand >>= 1;
      exponent++;
    }
    if (exponent >= kMaxExponent) {
      return kInfinity;
    }
    if (exponent < kDenormalExponent) {
      return 0;
    }
    while (exponent > kDenormalExponent && (significand & kHiddenBit) == 0) {
      significand <<= 1;
      exponent--;
    }
    uint64_t biased_exponent;
    if (exponent == kDenormalExponent && (significand & kHiddenBit) == 0) {
      biased_exponent = 0;
    } else {
      biased_exponent = static_cast<uint64_t>(exponent + kExponentBias);
    }
    return (significand & kSignificandMask) |
        (biased_exponent << kPhysicalSignificandSize);
  }